

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_delete.hpp
# Opt level: O0

void boost::
     checked_delete<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>const>
               (results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *x)

{
  results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  
  if (in_RDI != (results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    xpressive::detail::
    results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~results_extras(in_RDI);
    operator_delete(in_RDI);
  }
  return;
}

Assistant:

inline void checked_delete(T * x) BOOST_NOEXCEPT
{
#if defined(__cpp_static_assert) && __cpp_static_assert >= 200410L

    static_assert( sizeof(T) != 0, "Type must be complete" );

#else

    typedef char type_must_be_complete[ sizeof(T) ];
    (void) sizeof(type_must_be_complete);

#endif

    delete x;
}